

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O2

bool __thiscall ShParser::parseParameters(ShParser *this,Parser *parser,tShOpcode *opcode)

{
  pointer pFVar1;
  char cVar2;
  Parser *__s;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  __type _Var6;
  bool bVar7;
  int iVar8;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Token *pTVar9;
  Identifier *pIVar10;
  ShParser *pSVar11;
  pointer __s2;
  char **ppcVar12;
  char *encoding;
  allocator<char> local_81;
  undefined1 local_80 [32];
  ShImmediateData *local_60;
  _Base_ptr local_58;
  
  local_80._0_8_ = opcode->encoding;
  local_60 = &this->immediate;
  (this->immediate).primary.type = None;
  local_80._16_8_ = &(this->registers).grt;
  local_58 = (_Base_ptr)&(this->immediate).primary.expression;
  __s2 = (pointer)local_80._0_8_;
  local_80._8_8_ = this;
  local_80._24_8_ = opcode;
LAB_0016031a:
  if (*(char *)&__s2->tokenizer == '\0') {
    pcVar3 = *(char **)local_80._24_8_;
    pcVar4 = *(char **)(local_80._24_8_ + 8);
    uVar5 = *(undefined8 *)(local_80._24_8_ + 0x18);
    *(undefined8 *)&(((ShOpcodeData *)(local_80._8_8_ + 0x88))->opcode).base =
         *(undefined8 *)(local_80._24_8_ + 0x10);
    *(undefined8 *)&(((ShOpcodeData *)(local_80._8_8_ + 0x88))->opcode).archs = uVar5;
    (((ShOpcodeData *)(local_80._8_8_ + 0x88))->opcode).name = pcVar3;
    (((ShOpcodeData *)(local_80._8_8_ + 0x88))->opcode).encoding = pcVar4;
    pTVar9 = Parser::nextToken(parser);
    return pTVar9->type == Separator;
  }
  if ((*(int *)(local_80._24_8_ + 0x1c) & 8) != 0) {
    this = (ShParser *)parser;
    pTVar9 = Parser::peekToken(parser,0);
    ppcVar12 = shSpecialForcedRegisters;
    do {
      __s = (Parser *)*ppcVar12;
      if (__s == (Parser *)0x0) goto LAB_00160330;
      __n = strlen((char *)__s);
      this = (ShParser *)__s;
      iVar8 = bcmp(__s,__s2,__n);
      ppcVar12 = ppcVar12 + 1;
    } while (iVar8 != 0);
    if (pTVar9->type == Identifier) {
      __lhs = &Token::identifierValue(pTVar9)->_name;
      this = (ShParser *)&stack0xffffffffffffffb0;
      std::__cxx11::string::string<std::allocator<char>>((string *)this,(char *)__s,&local_81);
      _Var6 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)this);
      std::__cxx11::string::~string((string *)this);
      if (_Var6) {
        __s2 = (pointer)((long)&__s2->tokenizer + __n);
        this = (ShParser *)parser;
        local_80._0_8_ = __s2;
        Parser::eatToken(parser);
        goto LAB_0016031a;
      }
    }
  }
LAB_00160330:
  pFVar1 = (pointer)((long)&__s2->tokenizer + 1);
  cVar2 = *(char *)&__s2->tokenizer;
  local_80._0_8_ = pFVar1;
  if (cVar2 == '@') {
    pTVar9 = Parser::peekToken(parser,0);
    if (pTVar9->type != Identifier) {
      return false;
    }
    this = (ShParser *)Parser::peekToken(parser,0);
    pIVar10 = Token::identifierValue((Token *)this);
    if (*(pIVar10->_name)._M_dataplus._M_p != '@') {
      return false;
    }
    cVar2 = *(char *)&pFVar1->tokenizer;
    if ((cVar2 == '(') || (cVar2 == '-')) {
      this = (ShParser *)parser;
      Parser::eatToken(parser);
      bVar7 = matchSymbol(this,parser,*(char *)&pFVar1->tokenizer);
    }
    else {
      pSVar11 = (ShParser *)local_80._8_8_;
      if ((cVar2 != 's') && (pSVar11 = (ShParser *)local_80._16_8_, cVar2 != 't')) {
        return false;
      }
      bVar7 = parseRegister(this,parser,(ShRegisterValue *)pSVar11);
    }
    if (bVar7 == false) {
      return false;
    }
    local_80._0_8_ = (long)&__s2->tokenizer + 2;
    __s2 = (pointer)local_80._0_8_;
  }
  else if (cVar2 == 'i') {
    bVar7 = parseImmediate(this,parser,(Expression *)local_58);
    if (!bVar7) {
      return false;
    }
    this = (ShParser *)local_80;
    bVar7 = decodeImmediateSize((char **)this,(ShImmediateType *)local_60);
    __s2 = (pointer)local_80._0_8_;
    if (!bVar7) {
      return false;
    }
  }
  else {
    pSVar11 = (ShParser *)local_80._8_8_;
    if ((cVar2 == 's') || (pSVar11 = (ShParser *)local_80._16_8_, cVar2 == 't')) {
      bVar7 = parseRegister(this,parser,(ShRegisterValue *)pSVar11);
    }
    else {
      bVar7 = matchSymbol(this,parser,cVar2);
    }
    __s2 = pFVar1;
    if (bVar7 == false) {
      return false;
    }
  }
  goto LAB_0016031a;
}

Assistant:

bool ShParser::parseParameters(Parser& parser, const tShOpcode& opcode)
{
	const char* encoding = opcode.encoding;

	// initialize opcode variables
	immediate.primary.type = ShImmediateType::None;

	while (*encoding != 0)
	{
		// Some registers in instructions are forced
		// and do not have a numerical representation (except for r0.)
		// This handles said forced registers.
		if (opcode.flags & SH_FREG)
		{
			const char **fReg = shSpecialForcedRegisters;
			const Token &token = parser.peekToken();
			bool skip = false;
			while (*fReg)
			{
				size_t length = strlen(*fReg);
				if (memcmp(*fReg, encoding, length) == 0)
				{
					if (token.type != TokenType::Identifier)
						break;

					const auto &identifier = token.identifierValue();
					if (identifier.string() == std::string(*fReg))
					{
						skip = true;
						encoding += length;
						parser.eatToken();
						break;
					}
					break;
				}
				fReg += 1;
			}
			if (skip)
				continue;
		}

		switch (*encoding++)
		{
		case 't':	// register
			CHECK(parseRegister(parser,registers.grt));
			break;
		case 's':	// register
			CHECK(parseRegister(parser,registers.grs));
			break;
		case 'i':	// primary immediate
			CHECK(parseImmediate(parser,immediate.primary.expression));
			CHECK(decodeImmediateSize(encoding,immediate.primary.type));
			break;
		case '@':
			// '@' is not a separate token, and at the same time it's
			// part of the SuperH instruction parameter scheme,
			// so I came up with this rather ugly solution to handle it. 
			if (parser.peekToken().type != TokenType::Identifier)
				return false;
			if (parser.peekToken().identifierValue().string()[0] != '@')
				return false;
			if (*encoding == 't')
			{
				CHECK(parseRegister(parser,registers.grt));
			}
			else if (*encoding == 's')
			{
				CHECK(parseRegister(parser,registers.grs));
			}
			else if (*encoding == '(' || *encoding == '-') // "mov.* r0,@(i4,t)", "mov.* s,@-t" and the others
			{
				parser.eatToken();
				CHECK(matchSymbol(parser, *encoding));
			}
			else
			{
				return false;
			}
			encoding++;
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1)));
			break;
		}
	}

	opcodeData.opcode = opcode;

	// the next token has to be a separator, else the parameters aren't
	// completely parsed

	return parser.nextToken().type == TokenType::Separator;

}